

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall
amrex::EB2::Level::fillEdgeCent(Level *this,Array<MultiCutFab_*,_3> *a_edgecent,Geometry *geom)

{
  MultiCutFab *pMVar1;
  MultiFab *pMVar2;
  int idim;
  long lVar3;
  Array<MultiFab,_3> tmp;
  undefined **local_4e0;
  undefined1 local_4d8 [24];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  MultiFab local_4b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [12];
  
  if (this->m_allregular == true) {
    lVar3 = 0;
    do {
      MultiCutFab::setVal(a_edgecent->_M_elems[lVar3],1.0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  else {
    lVar3 = 0;
    do {
      MultiFab::MultiFab((MultiFab *)
                         ((long)&local_4b0[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                 _vptr_FabArrayBase + lVar3));
      lVar3 = lVar3 + 0x180;
    } while (lVar3 != 0x480);
    pMVar2 = local_4b0;
    lVar3 = 0;
    do {
      pMVar1 = a_edgecent->_M_elems[lVar3];
      local_4d8._0_8_ = (MultiFab *)0x1;
      local_4c0 = 0;
      uStack_4b8 = 0;
      local_4d8._8_8_ = (MultiFab *)0x0;
      local_4d8._16_8_ = (MultiFab *)0x0;
      local_4e0 = &PTR__FabFactory_00712918;
      (*(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (pMVar2,&(pMVar1->m_data).super_FabArrayBase.boxarray,
                 &(pMVar1->m_data).super_FabArrayBase.distributionMap,
                 (ulong)(uint)(pMVar1->m_data).super_FabArrayBase.n_comp,
                 (ulong)(uint)(pMVar1->m_data).super_FabArrayBase.n_grow.vect[0],local_4d8,
                 &local_4e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_4d8 + 0x10));
      lVar3 = lVar3 + 1;
      pMVar2 = pMVar2 + 1;
    } while (lVar3 != 3);
    pMVar2 = local_4b0;
    local_4d8._8_8_ = local_4b0 + 1;
    local_4d8._16_8_ = local_1b0;
    local_4d8._0_8_ = pMVar2;
    fillEdgeCent(this,(Array<MultiFab_*,_3> *)local_4d8,geom);
    lVar3 = 0;
    do {
      anon_unknown_2::copyMultiFabToMultiCutFab(a_edgecent->_M_elems[lVar3],pMVar2);
      lVar3 = lVar3 + 1;
      pMVar2 = pMVar2 + 1;
    } while (lVar3 != 3);
    lVar3 = 0x300;
    do {
      MultiFab::~MultiFab((MultiFab *)
                          ((long)&local_4b0[0].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                  _vptr_FabArrayBase + lVar3));
      lVar3 = lVar3 + -0x180;
    } while (lVar3 != -0x180);
  }
  return;
}

Assistant:

void
Level::fillEdgeCent (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_edgecent, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_edgecent[idim]->setVal(1.0);
        }
        return;
    }

    Array<MultiFab,AMREX_SPACEDIM> tmp;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        MultiCutFab const& edgecent = *a_edgecent[idim];
        tmp[idim].define(edgecent.boxArray(), edgecent.DistributionMap(),
                         edgecent.nComp(), edgecent.nGrow());
    }

    fillEdgeCent(GetArrOfPtrs(tmp), geom);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        copyMultiFabToMultiCutFab(*a_edgecent[idim], tmp[idim]);
    }
}